

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O2

void __thiscall OIS::InputManager::destroyInputObject(InputManager *this,Object *obj)

{
  iterator __position;
  undefined8 *puVar1;
  Object *obj_local;
  
  if (obj != (Object *)0x0) {
    obj_local = obj;
    __position = std::
                 _Rb_tree<OIS::Object_*,_std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>,_std::_Select1st<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
                 ::find(&(this->mFactoryObjects)._M_t,&obj_local);
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->mFactoryObjects)._M_t._M_impl.super__Rb_tree_header) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x20);
      *puVar1 = &PTR__exception_0012b8c8;
      puVar1[1] = 0xf500000008;
      puVar1[2] = 
      "/workspace/llm4binary/github/license_c_cmakelists/wgois[P]OIS/src/OISInputManager.cpp";
      puVar1[3] = "Object creator not known.";
      __cxa_throw(puVar1,&Exception::typeinfo,std::exception::~exception);
    }
    (**(code **)(*(long *)__position._M_node[1]._M_parent + 0x38))
              (__position._M_node[1]._M_parent,obj_local);
    std::
    _Rb_tree<OIS::Object*,std::pair<OIS::Object*const,OIS::FactoryCreator*>,std::_Select1st<std::pair<OIS::Object*const,OIS::FactoryCreator*>>,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
    ::erase_abi_cxx11_((_Rb_tree<OIS::Object*,std::pair<OIS::Object*const,OIS::FactoryCreator*>,std::_Select1st<std::pair<OIS::Object*const,OIS::FactoryCreator*>>,std::less<OIS::Object*>,std::allocator<std::pair<OIS::Object*const,OIS::FactoryCreator*>>>
                        *)&this->mFactoryObjects,__position);
  }
  return;
}

Assistant:

void InputManager::destroyInputObject(Object* obj)
{
	if(obj == nullptr)
		return;

	FactoryCreatedObject::iterator i = mFactoryObjects.find(obj);
	if(i != mFactoryObjects.end())
	{
		i->second->destroyObject(obj);
		mFactoryObjects.erase(i);
	}
	else
	{
		OIS_EXCEPT(E_General, "Object creator not known.");
	}
}